

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O1

int cram_load_reference(cram_fd *fd,char *fn)

{
  int iVar1;
  refs_t *prVar2;
  uint is_err;
  SAM_hdr *h;
  char *pcVar3;
  
  if (fn != (char *)0x0) {
    if (fd->embed_ref == 0) {
      is_err = 1;
    }
    else {
      is_err = (uint)(fd->mode != 0x72);
    }
    prVar2 = refs_load_fai(fd->refs,fn,is_err);
    fd->refs = prVar2;
    if (prVar2 != (refs_t *)0x0) {
      pcVar3 = prVar2->fn;
      goto LAB_0012f9d2;
    }
  }
  pcVar3 = (char *)0x0;
LAB_0012f9d2:
  fd->ref_fn = pcVar3;
  prVar2 = fd->refs;
  if (((prVar2 == (refs_t *)0x0) || ((prVar2->nref == 0 && (pcVar3 == (char *)0x0)))) &&
     (fd->header != (SAM_hdr *)0x0)) {
    if (prVar2 != (refs_t *)0x0) {
      refs_free(prVar2);
    }
    prVar2 = refs_create();
    fd->refs = prVar2;
    if (prVar2 == (refs_t *)0x0) {
      return -1;
    }
    iVar1 = refs_from_header(prVar2,(cram_fd *)fd->header,h);
    if (iVar1 == -1) {
      return -1;
    }
  }
  if ((fd->header != (SAM_hdr *)0x0) && (iVar1 = refs2id(fd->refs,fd->header), iVar1 == -1)) {
    return -1;
  }
  return -(uint)(pcVar3 == (char *)0x0);
}

Assistant:

int cram_load_reference(cram_fd *fd, char *fn) {
    if (fn) {
	fd->refs = refs_load_fai(fd->refs, fn,
				 !(fd->embed_ref && fd->mode == 'r'));
	fn = fd->refs ? fd->refs->fn : NULL;
    }
    fd->ref_fn = fn;

    if ((!fd->refs || (fd->refs->nref == 0 && !fn)) && fd->header) {
	if (fd->refs)
	    refs_free(fd->refs);
	if (!(fd->refs = refs_create()))
	    return -1;
	if (-1 == refs_from_header(fd->refs, fd, fd->header))
	    return -1;
    }

    if (fd->header)
	if (-1 == refs2id(fd->refs, fd->header))
	    return -1;

    return fn ? 0 : -1;
}